

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

int is_alike_mv(int_mv candidate_mv,center_mv_t *center_mvs,int center_mvs_count,
               int skip_alike_starting_mv)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (0 < center_mvs_count) {
    uVar1 = 0;
    do {
      iVar2 = (int)center_mvs[uVar1].mv.as_mv.col - ((int)candidate_mv.as_int >> 0x10);
      iVar4 = -iVar2;
      if (0 < iVar2) {
        iVar4 = iVar2;
      }
      if (iVar4 < (int)*(uint *)(&DAT_00503188 + (long)skip_alike_starting_mv * 4)) {
        uVar3 = (int)center_mvs[uVar1].mv.as_mv.row - (int)candidate_mv.as_mv.row;
        uVar5 = -uVar3;
        if (0 < (int)uVar3) {
          uVar5 = uVar3;
        }
        if (uVar5 < *(uint *)(&DAT_00503188 + (long)skip_alike_starting_mv * 4)) {
          return 1;
        }
      }
      uVar1 = uVar1 + 1;
    } while ((uint)center_mvs_count != uVar1);
  }
  return 0;
}

Assistant:

static int is_alike_mv(int_mv candidate_mv, center_mv_t *center_mvs,
                       int center_mvs_count, int skip_alike_starting_mv) {
  // MV difference threshold is in 1/8 precision.
  const int mv_diff_thr[3] = { 1, (8 << 3), (16 << 3) };
  int thr = mv_diff_thr[skip_alike_starting_mv];
  int i;

  for (i = 0; i < center_mvs_count; i++) {
    if (abs(center_mvs[i].mv.as_mv.col - candidate_mv.as_mv.col) < thr &&
        abs(center_mvs[i].mv.as_mv.row - candidate_mv.as_mv.row) < thr)
      return 1;
  }

  return 0;
}